

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualBoundViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  type_conflict5 tVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_1a0;
  cpp_dec_float<100U,_int,_void> local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  long local_130;
  type local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_1a0,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this);
  lVar2 = 0;
  local_138 = maxviol;
  for (local_130 = 0;
      local_130 <
      (this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum; local_130 = local_130 + 1) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_188,0.0,(type *)0x0);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)((local_1a0._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                 data._M_elems + lVar2),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)(((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .low.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                 _M_elems + lVar2));
    if (tVar1) {
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_88,
                 (cpp_dec_float<100U,_int,_void> *)
                 ((long)((local_1a0._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                        _M_elems + lVar2),
                 (cpp_dec_float<100U,_int,_void> *)
                 ((long)(((this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar2));
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_128,(multiprecision *)&local_88,arg);
      local_188.data._M_elems[0xc] = local_128.m_backend.data._M_elems[0xc];
      local_188.data._M_elems[0xd] = local_128.m_backend.data._M_elems[0xd];
      local_188.data._M_elems[0xe] = local_128.m_backend.data._M_elems[0xe];
      local_188.data._M_elems[0xf] = local_128.m_backend.data._M_elems[0xf];
      local_188.data._M_elems[8] = local_128.m_backend.data._M_elems[8];
      local_188.data._M_elems[9] = local_128.m_backend.data._M_elems[9];
      local_188.data._M_elems[10] = local_128.m_backend.data._M_elems[10];
      local_188.data._M_elems[0xb] = local_128.m_backend.data._M_elems[0xb];
      local_188.data._M_elems[4] = local_128.m_backend.data._M_elems[4];
      local_188.data._M_elems[5] = local_128.m_backend.data._M_elems[5];
      local_188.data._M_elems[6] = local_128.m_backend.data._M_elems[6];
      local_188.data._M_elems[7] = local_128.m_backend.data._M_elems[7];
      local_188.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
      local_188.data._M_elems[1] = local_128.m_backend.data._M_elems[1];
      local_188.data._M_elems[2] = local_128.m_backend.data._M_elems[2];
      local_188.data._M_elems[3] = local_128.m_backend.data._M_elems[3];
      local_188.exp = local_128.m_backend.exp;
      local_188.neg = local_128.m_backend.neg;
      local_188.fpclass = local_128.m_backend.fpclass;
      local_188.prec_elem = local_128.m_backend.prec_elem;
      maxviol = local_138;
    }
    else {
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)((local_1a0._M_impl.super__Vector_impl_data._M_start)->m_backend)
                                   .data._M_elems + lVar2),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(((this->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .up.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar2));
      if (tVar1) {
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 0x10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems[6] = 0;
        local_d8.data._M_elems[7] = 0;
        local_d8.data._M_elems[8] = 0;
        local_d8.data._M_elems[9] = 0;
        local_d8.data._M_elems[10] = 0;
        local_d8.data._M_elems[0xb] = 0;
        local_d8.data._M_elems[0xc] = 0;
        local_d8.data._M_elems[0xd] = 0;
        local_d8.data._M_elems._56_5_ = 0;
        local_d8.data._M_elems[0xf]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_d8,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)((local_1a0._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                          _M_elems + lVar2),
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(((this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar2));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_128,(multiprecision *)&local_d8,arg_00);
        local_188.data._M_elems[0xc] = local_128.m_backend.data._M_elems[0xc];
        local_188.data._M_elems[0xd] = local_128.m_backend.data._M_elems[0xd];
        local_188.data._M_elems[0xe] = local_128.m_backend.data._M_elems[0xe];
        local_188.data._M_elems[0xf] = local_128.m_backend.data._M_elems[0xf];
        local_188.data._M_elems[8] = local_128.m_backend.data._M_elems[8];
        local_188.data._M_elems[9] = local_128.m_backend.data._M_elems[9];
        local_188.data._M_elems[10] = local_128.m_backend.data._M_elems[10];
        local_188.data._M_elems[0xb] = local_128.m_backend.data._M_elems[0xb];
        local_188.data._M_elems[4] = local_128.m_backend.data._M_elems[4];
        local_188.data._M_elems[5] = local_128.m_backend.data._M_elems[5];
        local_188.data._M_elems[6] = local_128.m_backend.data._M_elems[6];
        local_188.data._M_elems[7] = local_128.m_backend.data._M_elems[7];
        local_188.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
        local_188.data._M_elems[1] = local_128.m_backend.data._M_elems[1];
        local_188.data._M_elems[2] = local_128.m_backend.data._M_elems[2];
        local_188.data._M_elems[3] = local_128.m_backend.data._M_elems[3];
        local_188.exp = local_128.m_backend.exp;
        local_188.neg = local_128.m_backend.neg;
        local_188.fpclass = local_128.m_backend.fpclass;
        local_188.prec_elem = local_128.m_backend.prec_elem;
      }
    }
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_188,maxviol);
    if (tVar1) {
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_188.data._M_elems._48_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe) = local_188.data._M_elems._56_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_188.data._M_elems._32_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_188.data._M_elems._40_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_188.data._M_elems._16_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_188.data._M_elems._24_8_;
      *(undefined8 *)(maxviol->m_backend).data._M_elems = local_188.data._M_elems._0_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_188.data._M_elems._8_8_;
      (maxviol->m_backend).exp = local_188.exp;
      (maxviol->m_backend).neg = local_188.neg;
      (maxviol->m_backend).fpclass = local_188.fpclass;
      (maxviol->m_backend).prec_elem = local_188.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&sumviol->m_backend,&local_188);
    lVar2 = lVar2 + 0x50;
  }
  std::
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~_Vector_base(&local_1a0);
  return;
}

Assistant:

void SPxSolverBase<R>::qualBoundViolation(
   R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int col = 0; col < this->nCols(); ++col)
   {
      assert(this->lower(col) <= this->upper(col) + 1e-9);

      R viol = 0.0;

      if(solu[col] < this->lower(col))
         viol = spxAbs(solu[col] - this->lower(col));
      else if(solu[col] > this->upper(col))
         viol = spxAbs(solu[col] - this->upper(col));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}